

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Hpipe::Context::Context(Context *this,CharItem *item,int flags)

{
  CharItem *pCStack_18;
  int flags_local;
  CharItem *item_local;
  Context *this_local;
  
  pCStack_18 = item;
  item_local = (CharItem *)this;
  Vec<const_Hpipe::CharItem_*>::Vec(&this->pos);
  this->mark = (InstructionMark *)0x0;
  Vec<unsigned_int>::Vec(&this->paths_to_mark);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::map(&this->paths_to_strings);
  this->flags = flags;
  Vec<const_Hpipe::CharItem_*>::operator<<(&this->pos,&stack0xffffffffffffffe8);
  return;
}

Assistant:

Context::Context( const CharItem *item, int flags ) : flags( flags ), mark( 0 ) {
    pos << item;
}